

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_struct(CompilerGLSL *this,SPIRType *type)

{
  uint32_t id;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  allocator local_79;
  TypedID<(spirv_cross::Types)1> *local_78;
  char *local_70 [4];
  string name;
  
  id = (type->type_alias).id;
  if ((id != 0) &&
     (bVar2 = Compiler::has_extended_decoration
                        (&this->super_Compiler,id,SPIRVCrossDecorationBufferBlockRepacked), !bVar2))
  {
    return;
  }
  add_resource_name(this,(type->super_IVariant).self.id);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(&name,this,type,0);
  local_70[0] = "struct ";
  if ((this->backend).explicit_struct_type != false) {
    local_70[0] = "";
  }
  statement<char_const*,std::__cxx11::string&>(this,local_70,&name);
  begin_scope(this);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(type->member_name_cache)._M_h);
  local_78 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
  ;
  uVar5 = 0;
  bVar2 = false;
  for (lVar4 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               buffer_size << 2; lVar4 != 0; lVar4 = lVar4 + -4) {
    add_member_name(this,type,(uint32_t)uVar5);
    uVar1 = local_78[uVar5].id;
    ::std::__cxx11::string::string((string *)local_70,"",&local_79);
    (*(this->super_Compiler)._vptr_Compiler[0x15])
              (this,type,(ulong)uVar1,uVar5 & 0xffffffff,(string *)local_70,0);
    ::std::__cxx11::string::~string((string *)local_70);
    uVar5 = uVar5 + 1;
    bVar2 = true;
  }
  if (((*(int *)&(type->super_IVariant).field_0xc == 0xf) &&
      ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
       buffer_size == 0)) && ((this->backend).supports_empty_struct == false)) {
    bVar2 = true;
    statement<char_const(&)[25]>(this,(char (*) [25])"int empty_struct_member;");
  }
  bVar3 = Compiler::has_extended_decoration
                    (&this->super_Compiler,(type->super_IVariant).self.id,
                     SPIRVCrossDecorationPaddingTarget);
  if (bVar3) {
    (*(this->super_Compiler)._vptr_Compiler[0x16])(this,type);
  }
  end_scope_decl(this);
  if (bVar2) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
  }
  ::std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void CompilerGLSL::emit_struct(SPIRType &type)
{
	// Struct types can be stamped out multiple times
	// with just different offsets, matrix layouts, etc ...
	// Type-punning with these types is legal, which complicates things
	// when we are storing struct and array types in an SSBO for example.
	// If the type master is packed however, we can no longer assume that the struct declaration will be redundant.
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
		return;

	add_resource_name(type.self);
	auto name = type_to_glsl(type);

	statement(!backend.explicit_struct_type ? "struct " : "", name);
	begin_scope();

	type.member_name_cache.clear();

	uint32_t i = 0;
	bool emitted = false;
	for (auto &member : type.member_types)
	{
		add_member_name(type, i);
		emit_struct_member(type, member, i);
		i++;
		emitted = true;
	}

	// Don't declare empty structs in GLSL, this is not allowed.
	if (type_is_empty(type) && !backend.supports_empty_struct)
	{
		statement("int empty_struct_member;");
		emitted = true;
	}

	if (has_extended_decoration(type.self, SPIRVCrossDecorationPaddingTarget))
		emit_struct_padding_target(type);

	end_scope_decl();

	if (emitted)
		statement("");
}